

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reference.cpp
# Opt level: O3

string * get_seq_from_reference
                   (string *__return_storage_ptr__,string *reference,
                   vector<chromosome_inf,_std::allocator<chromosome_inf>_> *chr_inf,
                   string *chromosome,uint64_t start,uint64_t end)

{
  pointer pcVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var6;
  uint32_t *puVar7;
  long lVar8;
  long lVar9;
  char local_260 [8];
  ifstream ref_handle;
  allocator<char> local_31;
  
  pcVar1 = (chr_inf->super__Vector_base<chromosome_inf,_std::allocator<chromosome_inf>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(chr_inf->super__Vector_base<chromosome_inf,_std::allocator<chromosome_inf>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)pcVar1;
  if (lVar4 == 0) {
    lVar9 = 0;
    lVar4 = 0;
  }
  else {
    lVar8 = (lVar4 >> 3) * 0x6db6db6db6db6db7;
    lVar8 = lVar8 + (ulong)(lVar8 == 0);
    pcVar5 = (chromosome->_M_dataplus)._M_p;
    puVar7 = &pcVar1->line_bases;
    lVar4 = 0;
    lVar9 = 0;
    do {
      iVar3 = strcmp((((chromosome_inf *)(puVar7 + -0xc))->chromosome)._M_dataplus._M_p,pcVar5);
      if (iVar3 == 0) {
        lVar4 = start / *puVar7 + *(uint64_t *)(puVar7 + -2) + start;
        lVar9 = end / *puVar7 + *(uint64_t *)(puVar7 + -2) + end;
      }
      puVar7 = puVar7 + 0xe;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  std::ifstream::ifstream(local_260,(string *)reference,_S_in);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"cant open refernce file",0x17);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    exit(-1);
  }
  pcVar5 = (char *)calloc((lVar9 - lVar4) + 1,1);
  std::istream::seekg((long)local_260,(_Ios_Seekdir)lVar4);
  std::istream::read(local_260,(long)pcVar5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,pcVar5,&local_31);
  _Var6._M_current = (__return_storage_ptr__->_M_dataplus)._M_p;
  local_31 = (allocator<char>)0xa;
  _Var6 = std::
          __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (_Var6,_Var6._M_current + __return_storage_ptr__->_M_string_length,
                     (_Iter_equals_val<const_char>)&local_31);
  __return_storage_ptr__->_M_string_length =
       (long)_Var6._M_current - (long)(__return_storage_ptr__->_M_dataplus)._M_p;
  *_Var6._M_current = '\0';
  std::ifstream::close();
  std::ifstream::~ifstream(local_260);
  return __return_storage_ptr__;
}

Assistant:

string get_seq_from_reference(string reference ,const vector<chromosome_inf> * chr_inf, string chromosome, uint64_t start , uint64_t end){
    uint64_t offset_start = 0;
    uint64_t offset_end = 0;
    for (size_t i = 0 ; i < (*chr_inf).size() ;i++){
        // uint64_t start_offset;
        // uint32_t line_bases;
        // uint32_t line_width;
        if ( strcmp ( (*chr_inf)[i].chromosome.c_str(), chromosome.c_str()) == 0){
            offset_start = (*chr_inf)[i].start_offset + start + start/(*chr_inf)[i].line_bases;
            offset_end = (*chr_inf)[i].start_offset + end + end/(*chr_inf)[i].line_bases;
        }
    }
    
    ifstream ref_handle (reference );
    if (ref_handle.is_open()){
        char * buffer =  (char *)calloc(offset_end-offset_start+1,sizeof(char));
        ref_handle.seekg(offset_start,ios::beg);  
        ref_handle.read(buffer,offset_end-offset_start);

        // std:remove(buffer, buffer+strlen(buffer), '\n') == '\0';
        string buff_string(buffer);
        buff_string.erase(std::remove(buff_string.begin(), buff_string.end(), '\n'), buff_string.end());
        ref_handle.close();
        return buff_string;
    }else{
        cerr << "cant open refernce file"<< endl;
        exit(-1);
    }
}